

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cc
# Opt level: O1

int64_t __thiscall rcg::Device::getModuleEvent(Device *this,int64_t _timeout)

{
  mutex *__mutex;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  _Alloc_hider _Var3;
  size_type sVar4;
  int iVar5;
  GC_ERROR GVar6;
  size_t sVar7;
  int *piVar8;
  long lVar9;
  CPort *this_00;
  CEventAdapterGeneric *this_01;
  GenTLException *pGVar10;
  undefined8 uVar11;
  pointer puVar12;
  ulong uVar13;
  uint64_t uVar14;
  int64_t iVar15;
  size_t size;
  INFO_DATATYPE type_1;
  size_t size_1;
  INFO_DATATYPE type;
  size_t value;
  size_t tmp_size;
  size_t local_f0;
  INFO_DATATYPE local_e4;
  string local_e0;
  pointer local_c0;
  string local_b8 [2];
  shared_ptr<const_rcg::GenTLWrapper> local_60;
  shared_ptr<const_rcg::GenTLWrapper> local_50;
  shared_ptr<const_rcg::GenTLWrapper> *local_40;
  size_t local_38;
  
  __mutex = &this->mtx;
  iVar5 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar5 == 0) {
    uVar14 = 0xffffffffffffffff;
    if (-1 < _timeout) {
      uVar14 = _timeout;
    }
    if (this->event == (EVENT_HANDLE)0x0) {
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      return -3;
    }
    if ((this->event_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        (this->event_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      local_b8[0]._M_dataplus._M_p = (pointer)0x0;
      local_e0._M_dataplus._M_p = (pointer)0x8;
      GVar6 = (*((this->gentl).
                 super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                EventGetInfo)(this->event,3,(INFO_DATATYPE *)&local_c0,local_b8,(size_t *)&local_e0)
      ;
      if (GVar6 == 0) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  (&this->event_buffer,(size_type)local_b8[0]._M_dataplus._M_p);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  (&this->event_value,(size_type)local_b8[0]._M_dataplus._M_p);
      }
    }
    puVar12 = (this->event_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((this->event_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish != puVar12) {
      uVar13 = 0;
      do {
        puVar12[uVar13] = '\0';
        (this->event_value).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar13] = '\0';
        uVar13 = uVar13 + 1;
        puVar12 = (this->event_buffer).
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
      } while (uVar13 < (ulong)((long)(this->event_buffer).
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)puVar12));
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    puVar12 = (this->event_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_f0 = (long)(this->event_buffer).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)puVar12;
    GVar6 = (*((this->gentl).super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->EventGetData)(this->event,puVar12,&local_f0,uVar14);
    iVar5 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
    if (iVar5 == 0) {
      _timeout = (int64_t)&this->gentl;
      if (GVar6 == 0) {
        local_e4 = 0;
        local_38 = 0x50;
        GVar6 = (*((this->gentl).
                   super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  EventGetDataInfo)(this->event,
                                    (this->event_buffer).
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start,local_f0,0,&local_e4,
                                    local_b8,&local_38);
        if (GVar6 != 0) {
          pGVar10 = (GenTLException *)__cxa_allocate_exception(0x28);
          local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_e0,"Device::getModuleEvent()","");
          GenTLException::GenTLException
                    (pGVar10,&local_e0,(shared_ptr<const_rcg::GenTLWrapper> *)_timeout);
          __cxa_throw(pGVar10,&GenTLException::typeinfo,GenTLException::~GenTLException);
        }
        if (local_e4 == 5) {
          iVar15 = (int64_t)(int)local_b8[0]._M_dataplus._M_p;
        }
        else {
          iVar15 = -1;
          if (local_e4 == 1) {
            local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
            local_40 = (shared_ptr<const_rcg::GenTLWrapper> *)_timeout;
            sVar7 = strlen((char *)local_b8);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_e0,local_b8,(long)&local_b8[0]._M_dataplus._M_p + sVar7);
            _Var3._M_p = local_e0._M_dataplus._M_p;
            piVar8 = __errno_location();
            iVar5 = *piVar8;
            *piVar8 = 0;
            lVar9 = strtol(_Var3._M_p,&local_c0,0x10);
            _timeout = (int64_t)local_40;
            if (local_c0 == _Var3._M_p) {
              std::__throw_invalid_argument("stoi");
LAB_0010ea1f:
              uVar11 = std::__throw_out_of_range("stoi");
              pthread_mutex_unlock((pthread_mutex_t *)__mutex);
              _Unwind_Resume(uVar11);
            }
            if (((int)lVar9 != lVar9) || (*piVar8 == 0x22)) goto LAB_0010ea1f;
            if (*piVar8 == 0) {
              *piVar8 = iVar5;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
              operator_delete(local_e0._M_dataplus._M_p);
            }
            iVar15 = (int64_t)(int)lVar9;
          }
        }
        local_e0._M_dataplus._M_p = local_e0._M_dataplus._M_p & 0xffffffff00000000;
        puVar12 = (this->event_value).
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
        local_f0 = (long)(this->event_value).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)puVar12;
        GVar6 = (*((this->gentl).
                   super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  EventGetDataInfo)(this->event,
                                    (this->event_buffer).
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start,local_f0,1,
                                    (INFO_DATATYPE *)&local_e0,puVar12,&local_f0);
        if (GVar6 != 0) {
          pGVar10 = (GenTLException *)__cxa_allocate_exception(0x28);
          local_b8[0]._M_dataplus._M_p = (pointer)&local_b8[0].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_b8,"Device::getModuleEvent()","");
          GenTLException::GenTLException
                    (pGVar10,local_b8,(shared_ptr<const_rcg::GenTLWrapper> *)_timeout);
          __cxa_throw(pGVar10,&GenTLException::typeinfo,GenTLException::~GenTLException);
        }
        if ((this->nodemap).super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr == (element_type *)0x0) {
          this_00 = (CPort *)operator_new(0x20);
          local_50.super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (this->gentl).super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
          local_50.super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi =
               (this->gentl).super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
          if (local_50.super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_50.super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_50.super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_50.super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_50.super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          CPort::CPort(this_00,&local_50,&this->dev);
          local_b8[0]._M_dataplus._M_p = (pointer)this_00;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<rcg::CPort*>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_b8[0]._M_string_length,
                     this_00);
          sVar4 = local_b8[0]._M_string_length;
          _Var3._M_p = local_b8[0]._M_dataplus._M_p;
          local_b8[0]._M_dataplus._M_p = (pointer)0x0;
          local_b8[0]._M_string_length = 0;
          p_Var1 = (this->cport).super___shared_ptr<rcg::CPort,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
          (this->cport).super___shared_ptr<rcg::CPort,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)_Var3._M_p;
          (this->cport).super___shared_ptr<rcg::CPort,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
               = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar4;
          if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8[0]._M_string_length !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8[0]._M_string_length)
            ;
          }
          if (local_50.super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_50.
                       super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          local_60.super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (this->gentl).super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
          local_60.super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi =
               (this->gentl).super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
          if (local_60.super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_60.super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_60.super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_60.super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_60.super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          allocNodeMap((rcg *)local_b8,&local_60,this->dev,
                       (this->cport).super___shared_ptr<rcg::CPort,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr,(char *)0x0);
          sVar4 = local_b8[0]._M_string_length;
          _Var3._M_p = local_b8[0]._M_dataplus._M_p;
          local_b8[0]._M_dataplus._M_p = (pointer)0x0;
          local_b8[0]._M_string_length = 0;
          p_Var1 = (this->nodemap).
                   super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
          (this->nodemap).super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (element_type *)_Var3._M_p;
          (this->nodemap).super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar4;
          if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8[0]._M_string_length !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8[0]._M_string_length)
            ;
          }
          if (local_60.super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_60.
                       super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
        }
        if ((this->eventadapter).
            super___shared_ptr<GenApi_3_4::CEventAdapterGeneric,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            == (element_type *)0x0) {
          this_01 = (CEventAdapterGeneric *)operator_new(0x20);
          GenApi_3_4::CEventAdapterGeneric::CEventAdapterGeneric
                    (this_01,(((this->nodemap).
                               super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr)->super_CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams>).
                             _Ptr);
          local_b8[0]._M_dataplus._M_p = (pointer)this_01;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<GenApi_3_4::CEventAdapterGeneric*>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_b8[0]._M_string_length,
                     this_01);
          sVar4 = local_b8[0]._M_string_length;
          _Var3._M_p = local_b8[0]._M_dataplus._M_p;
          local_b8[0]._M_dataplus._M_p = (pointer)0x0;
          local_b8[0]._M_string_length = 0;
          p_Var1 = (this->eventadapter).
                   super___shared_ptr<GenApi_3_4::CEventAdapterGeneric,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
          (this->eventadapter).
          super___shared_ptr<GenApi_3_4::CEventAdapterGeneric,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)_Var3._M_p;
          (this->eventadapter).
          super___shared_ptr<GenApi_3_4::CEventAdapterGeneric,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar4;
          if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8[0]._M_string_length !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8[0]._M_string_length)
            ;
          }
        }
        if (0 < iVar15) {
          peVar2 = (this->eventadapter).
                   super___shared_ptr<GenApi_3_4::CEventAdapterGeneric,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          (**(code **)(*(long *)peVar2 + 0x30))
                    (peVar2,(this->event_value).
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,local_f0 & 0xffffffff,iVar15);
        }
LAB_0010e8d1:
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        return iVar15;
      }
      iVar15 = -1;
      if (GVar6 == -0x3f3) goto LAB_0010e8d1;
      if (GVar6 == -0x3f4) {
        iVar15 = -2;
        goto LAB_0010e8d1;
      }
      goto LAB_0010e8f5;
    }
  }
  std::__throw_system_error(iVar5);
LAB_0010e8f5:
  pGVar10 = (GenTLException *)__cxa_allocate_exception(0x28);
  local_b8[0]._M_dataplus._M_p = (pointer)&local_b8[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"Device::getModuleEvent()","");
  GenTLException::GenTLException(pGVar10,local_b8,(shared_ptr<const_rcg::GenTLWrapper> *)_timeout);
  __cxa_throw(pGVar10,&GenTLException::typeinfo,GenTLException::~GenTLException);
}

Assistant:

int64_t Device::getModuleEvent(int64_t _timeout)
{
  int64_t eventid=-1;
  uint64_t timeout=GENTL_INFINITE;

  {
    std::lock_guard<std::mutex> lock(mtx);

    if (_timeout >= 0)
    {
      timeout=static_cast<uint64_t>(_timeout);
    }

    // check that streaming had been started

    if (event == 0)
    {
      return -3;
    }

    // determine memory for receiving the event

    if (event_buffer.size() == 0)
    {
      size_t value=0;

      GenTL::INFO_DATATYPE type;
      size_t size=sizeof(value);

      if (gentl->EventGetInfo(event, GenTL::EVENT_SIZE_MAX, &type, &value, &size) == GenTL::GC_ERR_SUCCESS)
      {
        event_buffer.resize(value);
        event_value.resize(value);
      }
    }

    // clear buffer

    for (size_t i=0; i<event_buffer.size(); i++)
    {
      event_buffer[i]=0;
      event_value[i]=0;
    }
  }

  // get event data

  size_t size=event_buffer.size();

  GenTL::GC_ERROR err=gentl->EventGetData(event, event_buffer.data(), &size, timeout);

  std::lock_guard<std::mutex> lock(mtx);

  // return 0 in case of abort and timeout and throw exception in case of
  // another error

  if (err == GenTL::GC_ERR_TIMEOUT)
  {
    return -1;
  }
  else if (err == GenTL::GC_ERR_ABORT)
  {
    return -2;
  }
  else if (err != GenTL::GC_ERR_SUCCESS)
  {
    throw GenTLException("Device::getModuleEvent()", gentl);
  }

  // get event ID

  {
    GenTL::INFO_DATATYPE type=GenTL::INFO_DATATYPE_UNKNOWN;
    char tmp[80];
    size_t tmp_size=sizeof(tmp);

    err=gentl->EventGetDataInfo(event, event_buffer.data(), size, GenTL::EVENT_DATA_ID,
      &type, tmp, &tmp_size);

    if (err != GenTL::GC_ERR_SUCCESS)
    {
      throw GenTLException("Device::getModuleEvent()", gentl);
    }

    if (type == GenTL::INFO_DATATYPE_STRING)
    {
      eventid=std::stoi(std::string(tmp), 0, 16);
    }
    else if (type == GenTL::INFO_DATATYPE_INT32)
    {
      int32_t value=0;
      memcpy(&value, tmp, sizeof(value));
      eventid=value;
    }
  }

  // get event value

  {
    GenTL::INFO_DATATYPE type=GenTL::INFO_DATATYPE_UNKNOWN;
    size=event_value.size();

    err=gentl->EventGetDataInfo(event, event_buffer.data(), size, GenTL::EVENT_DATA_VALUE,
      &type, event_value.data(), &size);

    if (err != GenTL::GC_ERR_SUCCESS)
    {
      throw GenTLException("Device::getModuleEvent()", gentl);
    }
  }

  if (!nodemap)
  {
    cport=std::shared_ptr<CPort>(new CPort(gentl, &dev));
    nodemap=allocNodeMap(gentl, dev, cport.get(), 0);
  }

  try
  {
    if (!eventadapter)
    {
      eventadapter=std::shared_ptr<GenApi::CEventAdapterGeneric>(new GenApi::CEventAdapterGeneric(nodemap->_Ptr));
    }

    if (eventid > 0)
    {
      eventadapter->DeliverMessage(event_value.data(), size, static_cast<uint64_t>(eventid));
    }
  }
  catch (const std::exception &)
  { }

  return eventid;
}